

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void sqlite3RowidConstraint(Parse *pParse,int onError,Table *pTab)

{
  char *p4;
  int errCode;
  
  if ((long)pTab->iPKey < 0) {
    p4 = sqlite3MPrintf(pParse->db,"%s.rowid",pTab->zName);
    errCode = 0xa13;
  }
  else {
    p4 = sqlite3MPrintf(pParse->db,"%s.%s",pTab->zName,pTab->aCol[pTab->iPKey].zCnName);
    errCode = 0x613;
  }
  sqlite3HaltConstraint(pParse,errCode,onError,p4,-6,'\x02');
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3RowidConstraint(
  Parse *pParse,    /* Parsing context */
  int onError,      /* Conflict resolution algorithm */
  Table *pTab       /* The table with the non-unique rowid */
){
  char *zMsg;
  int rc;
  if( pTab->iPKey>=0 ){
    zMsg = sqlite3MPrintf(pParse->db, "%s.%s", pTab->zName,
                          pTab->aCol[pTab->iPKey].zCnName);
    rc = SQLITE_CONSTRAINT_PRIMARYKEY;
  }else{
    zMsg = sqlite3MPrintf(pParse->db, "%s.rowid", pTab->zName);
    rc = SQLITE_CONSTRAINT_ROWID;
  }
  sqlite3HaltConstraint(pParse, rc, onError, zMsg, P4_DYNAMIC,
                        P5_ConstraintUnique);
}